

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

string * __thiscall
amrex::ParmParse::getPrefix_abi_cxx11_(string *__return_storage_ptr__,ParmParse *this)

{
  pointer pcVar1;
  _Elt_pointer pbVar2;
  
  pbVar2 = (this->m_pstack).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar2 == (this->m_pstack).c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar2 = (this->m_pstack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = pbVar2[-1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2[-1]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string
ParmParse::getPrefix() const
{
    return m_pstack.top();
}